

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::createSynth(QSynth *this)

{
  Synth *pSVar1;
  ReportHandler2 *local_40;
  QSynth *this_local;
  
  pSVar1 = this->synth;
  if (pSVar1 != (Synth *)0x0) {
    MT32Emu::Synth::~Synth(pSVar1);
    operator_delete(pSVar1,0x101e8);
  }
  pSVar1 = (Synth *)operator_new(0x101e8);
  MT32Emu::Synth::Synth(pSVar1,(ReportHandler *)0x0);
  this->synth = pSVar1;
  local_40 = (ReportHandler2 *)0x0;
  if (this != (QSynth *)0xffffffffffffff38) {
    local_40 = &(this->reportHandler).super_ReportHandler2;
  }
  MT32Emu::Synth::setReportHandler2(this->synth,local_40);
  return;
}

Assistant:

void QSynth::createSynth() {
	delete synth;
	synth = new Synth;
	synth->setReportHandler2(&reportHandler);
}